

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

Gia_Man_t * Of_ManDeriveMapping(Of_Man_t *p)

{
  uint *puVar1;
  uint uVar2;
  Jf_Par_t *pJVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  void *__s;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  Gia_Man_t *pGVar10;
  size_t sVar11;
  int iVar12;
  uint *puVar13;
  ulong uVar14;
  Vec_Int_t *local_60;
  
  pJVar3 = p->pPars;
  if ((pJVar3->fCutMin != 0) || (pGVar10 = p->pGia, pGVar10->vMapping != (Vec_Int_t *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0x6c2,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
  }
  uVar9 = pGVar10->nObjs;
  iVar6 = (int)pJVar3->Edge + uVar9;
  iVar12 = (int)pJVar3->Area;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < (iVar6 + iVar12 * 2) - 1U) {
    iVar7 = iVar6 + iVar12 * 2;
  }
  p_00->nCap = iVar7;
  if (iVar7 == 0) {
    p_00->pArray = (int *)0x0;
    if ((int)uVar9 < 1) goto LAB_0075ef75;
    sVar11 = (ulong)uVar9 * 4;
LAB_0075ef46:
    piVar4 = (int *)malloc(sVar11);
LAB_0075ef4e:
    p_00->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar9;
  }
  else {
    piVar4 = (int *)malloc((long)iVar7 << 2);
    p_00->pArray = piVar4;
    if (iVar7 < (int)uVar9) {
      sVar11 = (long)(int)uVar9 << 2;
      if (piVar4 == (int *)0x0) goto LAB_0075ef46;
      piVar4 = (int *)realloc(piVar4,sVar11);
      goto LAB_0075ef4e;
    }
  }
  if (0 < (int)uVar9) {
    memset(piVar4,0,(ulong)uVar9 * 4);
  }
LAB_0075ef75:
  p_00->nSize = uVar9;
  if (pJVar3->nFastEdges == 0) {
    local_60 = (Vec_Int_t *)0x0;
  }
  else {
    local_60 = (Vec_Int_t *)malloc(0x10);
    local_60->nCap = 1000;
    local_60->nSize = 0;
    piVar4 = (int *)malloc(4000);
    local_60->pArray = piVar4;
    Vec_IntPush(local_60,0);
    pGVar10 = p->pGia;
  }
  uVar9 = pGVar10->nObjs;
  iVar12 = (((int)uVar9 >> 5) + 1) - (uint)((uVar9 & 0x1f) == 0);
  if (iVar12 == 0) {
    sVar11 = 0;
    __s = (void *)0x0;
  }
  else {
    sVar11 = (long)iVar12 << 2;
    __s = malloc(sVar11);
  }
  memset(__s,0,sVar11);
  if (0 < (int)uVar9) {
    uVar14 = 0;
    do {
      uVar9 = (uint)*(undefined8 *)(pGVar10->pObjs + uVar14);
      if ((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) {
        if (p->pObjs[uVar14].nRefs != 0) {
          if (((uVar9 & 0x1fffffff) != 0x1fffffff) &&
             ((uVar9 & 0x1fffffff) ==
              ((uint)((ulong)*(undefined8 *)(pGVar10->pObjs + uVar14) >> 0x20) & 0x1fffffff))) {
            __assert_fail("!Gia_ObjIsBuf(Gia_ManObj(p->pGia,i))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                          ,0x6cf,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
          }
          if (uVar14 == 0) {
            __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                          ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
          }
          uVar9 = p->pObjs[uVar14].iCutH;
          uVar5 = (int)uVar9 >> 0x10;
          if (((int)uVar5 < 0) || ((p->vPages).nSize <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if ((long)p_00->nSize <= (long)uVar14) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          puVar13 = (uint *)((ulong)((uVar9 & 0xffff) << 2) + (long)(p->vPages).pArray[uVar5]);
          p_00->pArray[uVar14] = p_00->nSize;
          Vec_IntPush(p_00,*puVar13 & 0x1f);
          if ((*puVar13 & 0x1f) != 0) {
            uVar8 = 0;
            do {
              uVar9 = puVar13[uVar8 + 1];
              if ((int)uVar9 < 0) goto LAB_0075f265;
              if (uVar9 < 2) break;
              Vec_IntPush(p_00,uVar9 >> 1);
              uVar8 = uVar8 + 1;
            } while (uVar8 < (*puVar13 & 0x1f));
          }
          uVar9 = (uint)uVar14;
          Vec_IntPush(p_00,uVar9);
          if (local_60 != (Vec_Int_t *)0x0) {
            if ((uint)(iVar12 * 0x20) <= uVar14) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if ((*(uint *)((long)__s + (uVar14 >> 5 & 0x7ffffff) * 4) >> (uVar9 & 0x1f) & 1) == 0) {
              uVar5 = local_60->nSize;
              Vec_IntPush(local_60,0);
              Vec_IntPush(local_60,uVar9);
              uVar9 = *puVar13;
              if ((uVar9 & 0x1f) != 0) {
                uVar8 = 0;
                do {
                  uVar2 = puVar13[uVar8 + 1];
                  if ((int)uVar2 < 0) {
LAB_0075f265:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  if (uVar2 < 2) break;
                  if ((uVar2 & 1) != 0) {
                    uVar9 = uVar2 >> 1;
                    Vec_IntPush(local_60,uVar9);
                    if (iVar12 * 0x20 <= (int)uVar9) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecBit.h"
                                    ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                    }
                    puVar1 = (uint *)((long)__s + (ulong)(uVar2 >> 6) * 4);
                    *puVar1 = *puVar1 | 1 << ((byte)uVar9 & 0x1f);
                    uVar9 = *puVar13;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar8 < (uVar9 & 0x1f));
              }
              if (((int)uVar5 < 0) || (local_60->nSize <= (int)uVar5)) {
LAB_0075f33e:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x1da,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
              }
              piVar4 = local_60->pArray;
              piVar4[uVar5] = piVar4[uVar5] + local_60->nSize + ~uVar5;
              if (local_60->nSize < 1) goto LAB_0075f33e;
              *piVar4 = *piVar4 + 1;
            }
          }
        }
      }
      uVar14 = uVar14 + 1;
      pGVar10 = p->pGia;
    } while ((long)uVar14 < (long)pGVar10->nObjs);
  }
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0x6e4,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
  }
  pGVar10->vMapping = p_00;
  pGVar10->vPacking = local_60;
  if (__s != (void *)0x0) {
    free(__s);
  }
  return pGVar10;
}

Assistant:

Gia_Man_t * Of_ManDeriveMapping( Of_Man_t * p )
{
    Vec_Int_t * vMapping, * vPacking = NULL;
    Vec_Bit_t * vPointed; 
    int i, k, iVar, * pCut, Place, Flag;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    if ( p->pPars->nFastEdges )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    vPointed = Vec_BitStart( Gia_ManObjNum(p->pGia) );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Of_ObjRefNum(p, i) )
            continue;
        assert( !Gia_ObjIsBuf(Gia_ManObj(p->pGia,i)) );
        pCut = Of_ObjCutBestP( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Of_CutSize(pCut) );
        Of_CutForEachVar( pCut, iVar, k )
            Vec_IntPush( vMapping, iVar );
        Vec_IntPush( vMapping, i );
        if ( vPacking == NULL || Vec_BitEntry(vPointed, i) )
            continue;
        Place = Vec_IntSize( vPacking );
        Vec_IntPush( vPacking, 0 );
        Vec_IntPush( vPacking, i );
        Of_CutForEachVarFlag( pCut, iVar, Flag, k )
            if ( Flag )
            {
                Vec_IntPush( vPacking, iVar );
                Vec_BitWriteEntry( vPointed, iVar, 1 );
            }
        Vec_IntAddToEntry( vPacking, Place, Vec_IntSize(vPacking)-Place-1 );
        Vec_IntAddToEntry( vPacking, 0, 1 );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    p->pGia->vPacking = vPacking;
    Vec_BitFree( vPointed );
    return p->pGia;
}